

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_assign(Curl_multi *multi,curl_socket_t s,void *hashp)

{
  CURLMcode CVar1;
  Curl_sh_entry *pCVar2;
  
  pCVar2 = sh_getentry(&multi->sockhash,s);
  if (pCVar2 == (Curl_sh_entry *)0x0) {
    CVar1 = CURLM_BAD_SOCKET;
  }
  else {
    pCVar2->socketp = hashp;
    CVar1 = CURLM_OK;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_assign(struct Curl_multi *multi, curl_socket_t s,
                            void *hashp)
{
  struct Curl_sh_entry *there = NULL;

  there = sh_getentry(&multi->sockhash, s);

  if(!there)
    return CURLM_BAD_SOCKET;

  there->socketp = hashp;

  return CURLM_OK;
}